

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O1

EC_GROUP * EC_KEY_parse_curve_name(CBS *cbs)

{
  ulong uVar1;
  int iVar2;
  EC_GROUP *pEVar3;
  EC_GROUP *pEVar4;
  ulong uVar5;
  int line;
  bool bVar6;
  CBS named_curve;
  CBS CStack_38;
  
  iVar2 = CBS_get_asn1(cbs,&CStack_38,6);
  if (iVar2 == 0) {
    iVar2 = 0x80;
    line = 0x12d;
  }
  else {
    pEVar3 = EC_group_p224();
    iVar2 = CBS_mem_equal(&CStack_38,pEVar3->oid,(ulong)pEVar3->oid_len);
    if (iVar2 == 0) {
      uVar1 = 0;
      do {
        uVar5 = uVar1;
        pEVar4 = pEVar3;
        if (uVar5 == 3) break;
        pEVar4 = (*kAllGroups[uVar5 + 1])();
        iVar2 = CBS_mem_equal(&CStack_38,pEVar4->oid,(ulong)pEVar4->oid_len);
        uVar1 = uVar5 + 1;
      } while (iVar2 == 0);
      bVar6 = 2 < uVar5;
    }
    else {
      bVar6 = false;
      pEVar4 = pEVar3;
    }
    if (!bVar6) {
      return pEVar4;
    }
    iVar2 = 0x7b;
    line = 0x139;
  }
  ERR_put_error(0xf,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,line);
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_KEY_parse_curve_name(CBS *cbs) {
  CBS named_curve;
  if (!CBS_get_asn1(cbs, &named_curve, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return NULL;
  }

  // Look for a matching curve.
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (CBS_mem_equal(&named_curve, group->oid, group->oid_len)) {
      return (EC_GROUP *)group;
    }
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return NULL;
}